

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GetProcAddressExtensionCase::GetProcAddressExtensionCase
          (GetProcAddressExtensionCase *this,EglTestContext *eglTestCtx,char *name,char *description
          ,string *extName)

{
  GetProcAddressCase::GetProcAddressCase
            (&this->super_GetProcAddressCase,eglTestCtx,name,description);
  (this->super_GetProcAddressCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetProcAddressExtensionCase_01e06970;
  std::__cxx11::string::string((string *)&this->m_extName,(string *)extName);
  return;
}

Assistant:

GetProcAddressExtensionCase (EglTestContext& eglTestCtx, const char* name, const char* description, const std::string& extName)
		: GetProcAddressCase	(eglTestCtx, name, description)
		, m_extName				(extName)
	{
	}